

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilFormatsTests
               (TestCaseGroup *group,TestParams *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestContext *testCtx;
  pointer __src;
  undefined4 uVar2;
  long *plVar3;
  CopyImageToImageTestCase *this;
  pointer __dest;
  long lVar4;
  undefined8 in_RCX;
  string *psVar5;
  ulong *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  VkImageLayout extraout_EDX;
  VkImageLayout extraout_EDX_00;
  VkImageLayout layout;
  undefined8 in_RDX;
  long *extraout_RDX;
  long *plVar9;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar10;
  pointer pcVar11;
  size_t __n;
  undefined8 unaff_R15;
  string description;
  string testName;
  string *local_160;
  pointer local_158;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  string *local_100;
  long local_f8;
  string local_f0;
  TestNode *local_d0;
  string local_c8;
  string local_a8;
  Data local_88;
  VkDeviceSize VStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  long local_50;
  long local_48;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_40;
  
  paVar1 = &local_120.field_2;
  uVar8 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  lVar4 = 0;
  local_f0.field_2._8_8_ = params;
  local_d0 = &group->super_TestNode;
  do {
    local_f0.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
    (params->src).image.operationLayout = (&DAT_00aa90b0)[lVar4];
    unaff_R15 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    lVar4 = 0;
    do {
      (params->dst).image.operationLayout = (&DAT_00aa90b8)[lVar4];
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                ((string *)(local_150 + 0x10),
                 (_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 (VkImageLayout)in_RDX);
      plVar3 = (long *)std::__cxx11::string::append((char *)(local_150 + 0x10));
      psVar5 = (string *)(plVar3 + 2);
      if ((string *)*plVar3 == psVar5) {
        local_150._0_8_ = (psVar5->_M_dataplus)._M_p;
        local_150._8_8_ = plVar3[3];
        local_160 = (string *)local_150;
      }
      else {
        local_150._0_8_ = (psVar5->_M_dataplus)._M_p;
        local_160 = (string *)*plVar3;
      }
      local_158 = (pointer)plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_120,(_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,
                 (VkImageLayout)local_158);
      pcVar11 = (pointer)0xf;
      if (local_160 != (string *)local_150) {
        pcVar11 = (pointer)local_150._0_8_;
      }
      if (pcVar11 < (pointer)(local_120._M_string_length + (long)local_158)) {
        uVar8 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
          uVar8 = local_120.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < (pointer)(local_120._M_string_length + (long)local_158))
        goto LAB_0043cf26;
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_120,0,(char *)0x0,(ulong)local_160);
      }
      else {
LAB_0043cf26:
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_160,(ulong)local_120._M_dataplus._M_p);
      }
      local_100 = &local_f0;
      psVar5 = (string *)(plVar3 + 2);
      if ((string *)*plVar3 == psVar5) {
        local_f0._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
        local_f0._M_string_length = plVar3[3];
      }
      else {
        local_f0._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
        local_100 = (string *)*plVar3;
      }
      plVar9 = plVar3 + 1;
      local_f8 = plVar3[1];
      *plVar3 = (long)psVar5;
      *plVar9 = 0;
      *(undefined1 *)&(psVar5->_M_dataplus)._M_p = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,
                        (ulong)(local_120.field_2._M_allocated_capacity + 1));
        plVar9 = extraout_RDX;
      }
      layout = (VkImageLayout)plVar9;
      if (local_160 != (string *)local_150) {
        operator_delete(local_160,(ulong)(local_150._0_8_ + 1));
        layout = extraout_EDX;
      }
      local_f0.field_2._M_allocated_capacity._4_4_ = (undefined4)unaff_R15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._16_8_ != &local_130) {
        operator_delete((void *)local_150._16_8_,local_130._M_allocated_capacity + 1);
        layout = extraout_EDX_00;
      }
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_a8,(_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 layout);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0xaa9601);
      puVar6 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_120.field_2._M_allocated_capacity = *puVar6;
        local_120.field_2._8_8_ = plVar3[3];
        local_120._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar6;
        local_120._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_120._M_string_length = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar7) {
        local_130._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_130._8_8_ = plVar3[3];
        local_150._16_8_ = &local_130;
      }
      else {
        local_130._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_150._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
      }
      local_150._24_8_ = plVar3[1];
      *plVar3 = (long)paVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_c8,(_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,
                 (VkImageLayout)local_150._24_8_);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._16_8_ != &local_130) {
        uVar8 = local_130._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_c8._M_string_length + local_150._24_8_) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          uVar8 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_c8._M_string_length + local_150._24_8_) goto LAB_0043d0f4;
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_c8,0,(char *)0x0,local_150._16_8_);
      }
      else {
LAB_0043d0f4:
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   (local_150 + 0x10,(ulong)local_c8._M_dataplus._M_p);
      }
      psVar5 = (string *)(plVar3 + 2);
      if ((string *)*plVar3 == psVar5) {
        local_150._0_8_ = (psVar5->_M_dataplus)._M_p;
        local_150._8_8_ = plVar3[3];
        local_160 = (string *)local_150;
      }
      else {
        local_150._0_8_ = (psVar5->_M_dataplus)._M_p;
        local_160 = (string *)*plVar3;
      }
      local_158 = (pointer)plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)&(psVar5->_M_dataplus)._M_p = 0;
      pcVar11 = local_158;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        pcVar11 = (pointer)(local_c8.field_2._M_allocated_capacity + 1);
        operator_delete(local_c8._M_dataplus._M_p,(ulong)pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._16_8_ != &local_130) {
        pcVar11 = (pointer)(local_130._M_allocated_capacity + 1);
        operator_delete((void *)local_150._16_8_,(ulong)pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        pcVar11 = (pointer)(local_120.field_2._M_allocated_capacity + 1);
        operator_delete(local_120._M_dataplus._M_p,(ulong)pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        pcVar11 = (pointer)(local_a8.field_2._M_allocated_capacity + 1);
        operator_delete(local_a8._M_dataplus._M_p,(ulong)pcVar11);
      }
      this = (CopyImageToImageTestCase *)operator_new(0xc0);
      testCtx = local_d0->m_testCtx;
      local_88.buffer.size = (Buffer)(params->src).buffer.size;
      local_88._8_8_ = *(undefined8 *)((long)&params->src + 8);
      local_88._16_8_ = *(undefined8 *)((long)&params->src + 0x10);
      VStack_70 = (params->dst).buffer.size;
      local_68 = *(undefined8 *)((long)&params->dst + 8);
      uStack_60 = *(undefined8 *)((long)&params->dst + 0x10);
      uVar10 = (long)(params->regions).
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(params->regions).
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      __dest = std::
               _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                              *)(((long)uVar10 >> 4) * -0x3333333333333333),(size_t)pcVar11);
      local_48 = (long)__dest + uVar10;
      __src = (params->regions).
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)(params->regions).
                  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
      local_58 = __dest;
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
      local_50 = __n + (long)__dest;
      local_40 = *(anon_union_4_2_42ec4cd4_for_TestParams_4 *)(local_f0.field_2._8_8_ + 0x48);
      CopyImageToImageTestCase::CopyImageToImageTestCase
                (this,testCtx,local_100,local_160,(TestParams *)&local_88.buffer);
      tcu::TestNode::addChild(local_d0,(TestNode *)this);
      in_RDX = extraout_RDX_00;
      if (__dest != (pointer)0x0) {
        operator_delete(__dest,uVar10);
        in_RDX = extraout_RDX_01;
      }
      uVar2 = local_f0.field_2._M_allocated_capacity._4_4_;
      if (local_160 != (string *)local_150) {
        operator_delete(local_160,(ulong)(local_150._0_8_ + 1));
        in_RDX = extraout_RDX_02;
      }
      params = (TestParams *)local_f0.field_2._8_8_;
      if (local_100 != &local_f0) {
        operator_delete(local_100,(ulong)(local_f0._M_dataplus._M_p + 1));
        in_RDX = extraout_RDX_03;
      }
      lVar4 = 1;
      unaff_R15 = 0;
    } while ((uVar2 & 1) != 0);
    uVar8 = 0;
    if ((local_f0.field_2._M_allocated_capacity._0_4_ & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void addImageToImageAllFormatsDepthStencilFormatsTests (tcu::TestCaseGroup* group, TestParams params)
{
	const VkImageLayout copySrcLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout copyDstLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(copySrcLayouts); ++srcLayoutNdx)
	{
		params.src.image.operationLayout = copySrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(copyDstLayouts); ++dstLayoutNdx)
		{
			params.dst.image.operationLayout = copyDstLayouts[dstLayoutNdx];

			const std::string testName		= getImageLayoutCaseName(params.src.image.operationLayout) + "_" +
											  getImageLayoutCaseName(params.dst.image.operationLayout);
			const std::string description	= "From layout " + getImageLayoutCaseName(params.src.image.operationLayout) +
											  " to " + getImageLayoutCaseName(params.dst.image.operationLayout);
			group->addChild(new CopyImageToImageTestCase(group->getTestContext(), testName, description, params));
		}
	}
}